

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase289::run(TestCase289 *this)

{
  word *pwVar1;
  size_t sVar2;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  ReaderOptions options;
  Reader root;
  ArrayPtr<const_capnp::word> segments [1];
  AlignedData<7> upgradedList;
  SegmentArrayMessageReader upgraded;
  Array<capnp::word> local_1d8;
  undefined1 local_1b8 [32];
  StructReader local_198;
  ArrayPtr<const_capnp::word> local_168;
  StructReader local_158;
  word local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  SegmentArrayMessageReader local_e8;
  
  local_168.ptr = &local_128;
  local_108 = 0x3300000001;
  uStack_100 = 0x605040403020100;
  local_118 = 0;
  uStack_110 = 0;
  local_128.content = 0x4000000000000;
  uStack_120 = 0;
  local_f8 = 0x10090807;
  local_168.size_ = 7;
  segments_00.size_ = 1;
  segments_00.ptr = &local_168;
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  SegmentArrayMessageReader::SegmentArrayMessageReader(&local_e8,segments_00,options);
  MessageReader::getRootInternal((Reader *)local_1b8,&local_e8.super_MessageReader);
  local_158.data = (void *)local_1b8._16_8_;
  local_158.pointers = (WirePointer *)local_1b8._24_8_;
  local_158.segment = (SegmentReader *)local_1b8._0_8_;
  local_158.capTable = (CapTableReader *)local_1b8._8_8_;
  PointerReader::getStruct(&local_198,(PointerReader *)&local_158,(word *)0x0);
  local_158.dataSize = local_198.dataSize;
  local_158.pointerCount = local_198.pointerCount;
  local_158._38_2_ = local_198._38_2_;
  local_158.nestingLimit = local_198.nestingLimit;
  local_158._44_4_ = local_198._44_4_;
  local_158.data = local_198.data;
  local_158.pointers = local_198.pointers;
  local_158.segment = local_198.segment;
  local_158.capTable = local_198.capTable;
  StructReader::canonicalize(&local_1d8,&local_158);
  sVar2 = local_1d8.size_;
  pwVar1 = local_1d8.ptr;
  if (local_1d8.ptr != (word *)0x0) {
    local_1d8.ptr = (word *)0x0;
    local_1d8.size_ = 0;
    (*(code *)**(undefined8 **)local_1d8.disposer)(local_1d8.disposer,pwVar1,8,sVar2,sVar2,0);
  }
  SegmentArrayMessageReader::~SegmentArrayMessageReader(&local_e8);
  return;
}

Assistant:

TEST(WireFormat, StructRoundTrip_OneSegment) {
  MallocMessageBuilder message;
  BuilderArena arena(&message);
  auto allocation = arena.allocate(1 * WORDS);
  SegmentBuilder* segment = allocation.segment;
  word* rootLocation = allocation.words;

  StructBuilder builder = PointerBuilder::getRoot(segment, nullptr, rootLocation)
      .initStruct(StructSize(2 * WORDS, 4 * POINTERS));
  setupStruct(builder);

  // word count:
  //    1  root pointer
  //    6  root struct
  //    1  sub message
  //    2  3-element int32 list
  //   13  struct list
  //         1 tag
  //        12 4x struct
  //           1 data section
  //           1 pointer section
  //           1 sub-struct
  //   11  list list
  //         5 pointers to sub-lists
  //         6 sub-lists (4x 1 word, 1x 2 words)
  // -----
  //   34
  kj::ArrayPtr<const kj::ArrayPtr<const word>> segments = arena.getSegmentsForOutput();
  ASSERT_EQ(1u, segments.size());
  EXPECT_EQ(34u, segments[0].size());

  checkStruct(builder);
  checkStruct(builder.asReader());
  checkStruct(PointerReader::getRootUnchecked(segment->getStartPtr()).getStruct(nullptr));
  checkStruct(PointerReader::getRoot(segment, nullptr, segment->getStartPtr(), 4)
      .getStruct(nullptr));
}